

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess_test.cc
# Opt level: O1

void __thiscall SubprocessTestSetWithSingle::Run(SubprocessTestSetWithSingle *this)

{
  SubprocessSet *this_00;
  _Map_pointer pppSVar1;
  Test *pTVar2;
  bool bVar3;
  ExitStatus EVar4;
  int iVar5;
  Subprocess *this_01;
  string *psVar6;
  string local_40;
  
  this_00 = &(this->super_SubprocessTest).subprocs_;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"ls /","");
  this_01 = SubprocessSet::Add(this_00,&local_40,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  bVar3 = testing::Test::Check
                    (g_current_test,this_01 != (Subprocess *)0x0,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                     ,0xcb,"(Subprocess *) 0 != subproc");
  if (bVar3) {
    (this->super_SubprocessTest).subprocs_.token_available_ = false;
    while (bVar3 = Subprocess::Done(this_01), !bVar3) {
      SubprocessSet::DoWork(this_00,(TokenPool *)0x0);
    }
    bVar3 = testing::Test::Check
                      (g_current_test,
                       (bool)((this->super_SubprocessTest).subprocs_.token_available_ ^ 1),
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                       ,0xd1,"subprocs_.IsTokenAvailable()");
    pTVar2 = g_current_test;
    if (bVar3) {
      EVar4 = Subprocess::Finish(this_01);
      bVar3 = testing::Test::Check
                        (pTVar2,EVar4 == ExitSuccess,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                         ,0xd2,"ExitSuccess == subproc->Finish()");
      pTVar2 = g_current_test;
      if (bVar3) {
        psVar6 = Subprocess::GetOutput_abi_cxx11_(this_01);
        iVar5 = std::__cxx11::string::compare((char *)psVar6);
        bVar3 = testing::Test::Check
                          (pTVar2,iVar5 != 0,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                           ,0xd3,"\"\" != subproc->GetOutput()");
        if ((bVar3) &&
           (pppSVar1 = *(_Map_pointer *)
                        ((long)&(this->super_SubprocessTest).subprocs_.finished_.c.
                                super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>.
                                _M_impl.super__Deque_impl_data + 0x48),
           bVar3 = testing::Test::Check
                             (g_current_test,
                              ((long)*(_Elt_pointer *)
                                      ((long)&(this->super_SubprocessTest).subprocs_.finished_.c.
                                              super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>
                                              ._M_impl.super__Deque_impl_data + 0x20) -
                               (long)((iterator *)
                                     ((long)&(this->super_SubprocessTest).subprocs_.finished_.c.
                                             super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>
                                             ._M_impl.super__Deque_impl_data + 0x10))->_M_cur >> 3)
                              + ((long)((iterator *)
                                       ((long)&(this->super_SubprocessTest).subprocs_.finished_.c.
                                               super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>
                                               ._M_impl.super__Deque_impl_data + 0x30))->_M_cur -
                                 (long)*(_Elt_pointer *)
                                        ((long)&(this->super_SubprocessTest).subprocs_.finished_.c.
                                                super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>
                                                ._M_impl.super__Deque_impl_data + 0x38) >> 3) +
                              ((((ulong)((long)pppSVar1 -
                                        (long)*(_Map_pointer *)
                                               ((long)&(this->super_SubprocessTest).subprocs_.
                                                       finished_.c.
                                                                                                              
                                                  super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>
                                                  ._M_impl.super__Deque_impl_data + 0x28)) >> 3) - 1
                               ) + (ulong)(pppSVar1 == (_Map_pointer)0x0)) * 0x40 == 1,
                              "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                              ,0xd5,"1u == subprocs_.finished_.size()"), bVar3)) {
          return;
        }
      }
    }
  }
  g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  return;
}

Assistant:

TEST_F(SubprocessTest, SetWithSingle) {
  Subprocess* subproc = subprocs_.Add(kSimpleCommand);
  ASSERT_NE((Subprocess *) 0, subproc);

  subprocs_.ResetTokenAvailable();
  while (!subproc->Done()) {
    subprocs_.DoWork(NULL);
  }
  ASSERT_FALSE(subprocs_.IsTokenAvailable());
  ASSERT_EQ(ExitSuccess, subproc->Finish());
  ASSERT_NE("", subproc->GetOutput());

  ASSERT_EQ(1u, subprocs_.finished_.size());
}